

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutablePriorityQueue.h
# Opt level: O3

void __thiscall
MutablePriorityQueue<Vertex<std::pair<double,_double>_>_>::heapifyDown
          (MutablePriorityQueue<Vertex<std::pair<double,_double>_>_> *this,uint i)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  Vertex<std::pair<double,_double>_> *pVVar5;
  Vertex<std::pair<double,_double>_> *pVVar6;
  pointer ppVVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  ppVVar7 = (this->H).
            super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar5 = ppVVar7[i];
  uVar12 = (ulong)(i * 2);
  uVar8 = (long)(this->H).
                super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar7 >> 3;
  bVar4 = this->inv;
  uVar9 = (ulong)i;
  if (uVar12 < uVar8) {
    uVar10 = (ulong)((bVar4 & 1) << 4);
    dVar2 = *(double *)((long)&pVVar5->dist + uVar10);
    uVar9 = (ulong)i;
    do {
      i = (uint)uVar9;
      uVar11 = (ulong)((uint)uVar12 | 1);
      if ((uVar8 <= uVar11) ||
         (dVar3 = *(double *)((long)&ppVVar7[uVar12]->dist + uVar10),
         pdVar1 = (double *)((long)&ppVVar7[uVar11]->dist + uVar10),
         dVar3 < *pdVar1 || dVar3 == *pdVar1)) {
        uVar11 = uVar12;
      }
      pVVar6 = ppVVar7[uVar11];
      pdVar1 = (double *)((long)&pVVar6->dist + uVar10);
      if (dVar2 < *pdVar1 || dVar2 == *pdVar1) break;
      ppVVar7[uVar9] = pVVar6;
      if ((bVar4 & 1U) == 0) {
        pVVar6->queueIndex = i;
      }
      else {
        pVVar6->queueIndexInv = i;
      }
      uVar12 = (ulong)((uint)uVar11 * 2);
      ppVVar7 = (this->H).
                super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(this->H).
                    super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar7 >> 3;
      uVar9 = uVar11;
      i = (uint)uVar11;
    } while (uVar12 < uVar8);
  }
  ppVVar7[uVar9] = pVVar5;
  if ((bVar4 & 1U) == 0) {
    pVVar5->queueIndex = i;
  }
  else {
    pVVar5->queueIndexInv = i;
  }
  return;
}

Assistant:

void MutablePriorityQueue<T>::heapifyDown(unsigned i) {
	auto x = H[i];
	while (true) {
		unsigned k = leftChild(i);
		if (k >= H.size())
			break;
		if (k+1 < H.size() && (*H[k+1]).compare(*H[k], inv))
			++k; // right child of i
		if ( ! ((*H[k]).compare(*x, inv)) )
			break;
		set(i, H[k]);
		i = k;
	}
	set(i, x);
}